

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool SetWrap(TidyDocImpl *doc,uint indent)

{
  Bool BVar1;
  Bool wrap;
  TidyPrintImpl *pprint;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  BVar1 = (Bool)((ulong)(indent + (doc->pprint).linelen) < (doc->config).value[0x5d].v);
  if (BVar1 == no) {
    if ((doc->pprint).ixInd == 0) {
      (doc->pprint).indent[1].spaces = indent;
      (doc->pprint).ixInd = 1;
    }
  }
  else {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = (doc->pprint).linelen;
  }
  return BVar1;
}

Assistant:

static Bool SetWrap( TidyDocImpl* doc, uint indent )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrap = ( indent + pprint->linelen < cfg(doc, TidyWrapLen) );
    if ( wrap )
    {
        if ( pprint->indent[0].spaces < 0 )
            pprint->indent[0].spaces = indent;
        pprint->wraphere = pprint->linelen;
    }
    else if ( pprint->ixInd == 0 )
    {
        /* Save indent 1st time we pass the the wrap line */
        pprint->indent[ 1 ].spaces = indent;
        pprint->ixInd = 1;
    }
    return wrap;
}